

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divideAndConquer.cpp
# Opt level: O0

Num * __thiscall
divideAndConquer::multiply(Num *__return_storage_ptr__,divideAndConquer *this,Num *n1,Num *n2)

{
  Short SVar1;
  Short SVar2;
  unsigned_short *puVar3;
  Num local_390;
  Num local_368;
  undefined1 local_339;
  undefined1 local_338 [8];
  Num t_2m;
  Num tk1;
  string str_t;
  undefined1 local_2c0 [4];
  int t_x2;
  Num local_298;
  Num local_270;
  Num local_248;
  undefined1 local_220 [8];
  Num x4;
  Num x3;
  Num x2;
  Num x1;
  Halves local_130;
  undefined1 local_e0 [8];
  Halves b;
  Halves a;
  Short m;
  gradeSchoolMultiplication local_30;
  gradeSchoolMultiplication t;
  Num *n2_local;
  Num *n1_local;
  divideAndConquer *this_local;
  Num *x5;
  
  t.super_Multiplicator._vptr_Multiplicator = (Multiplicator)(Multiplicator)n2;
  if ((n1->size == 1) || (n2->size == 1)) {
    gradeSchoolMultiplication::gradeSchoolMultiplication(&local_30);
    gradeSchoolMultiplication::multiply
              (__return_storage_ptr__,&local_30,n1,(Num *)t.super_Multiplicator._vptr_Multiplicator)
    ;
    gradeSchoolMultiplication::~gradeSchoolMultiplication(&local_30);
  }
  else {
    puVar3 = std::max<unsigned_short>(&n1->size,&n2->size);
    a.second._34_2_ = *puVar3;
    std::pair<Num,_Num>::pair<Num,_Num,_true>((pair<Num,_Num> *)&b.second.field_0x20);
    std::pair<Num,_Num>::pair<Num,_Num,_true>((pair<Num,_Num> *)local_e0);
    Num::getHalf(&local_130,n1,a.second._34_2_);
    std::pair<Num,_Num>::operator=((pair<Num,_Num> *)&b.second.field_0x20,&local_130);
    std::pair<Num,_Num>::~pair(&local_130);
    Num::getHalf((Halves *)&x1.field_0x20,(Num *)t.super_Multiplicator._vptr_Multiplicator,
                 a.second._34_2_);
    std::pair<Num,_Num>::operator=((pair<Num,_Num> *)local_e0,(type)&x1.field_0x20);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)&x1.field_0x20);
    Num::Num((Num *)&x2.field_0x20);
    Num::Num((Num *)&x3.field_0x20);
    Num::Num((Num *)&x4.field_0x20);
    Num::Num((Num *)local_220);
    (**(this->super_Multiplicator)._vptr_Multiplicator)
              (&local_248,this,&a.first.field_0x20,&b.first.field_0x20);
    Num::operator=((Num *)&x2.field_0x20,&local_248);
    Num::~Num(&local_248);
    (**(this->super_Multiplicator)._vptr_Multiplicator)
              (&local_270,this,&b.second.field_0x20,&b.first.field_0x20);
    Num::operator=((Num *)&x3.field_0x20,&local_270);
    Num::~Num(&local_270);
    (**(this->super_Multiplicator)._vptr_Multiplicator)
              (&local_298,this,&a.first.field_0x20,local_e0);
    Num::operator=((Num *)&x4.field_0x20,&local_298);
    Num::~Num(&local_298);
    (**(this->super_Multiplicator)._vptr_Multiplicator)
              (local_2c0,this,&b.second.field_0x20,local_e0);
    Num::operator=((Num *)local_220,(Num *)local_2c0);
    Num::~Num((Num *)local_2c0);
    SVar1 = Num::getNumber((Num *)&x3.field_0x20);
    SVar2 = Num::getNumber((Num *)&x4.field_0x20);
    std::__cxx11::to_string((__cxx11 *)&tk1.field_0x20,(uint)SVar1 + (uint)SVar2);
    Num::multiplyByPowerOfTen((Num *)&t_2m.field_0x20,(Num *)local_220,a.second._34_2_);
    SVar1 = std::__cxx11::string::size();
    Num::Num((Num *)local_338,(string *)&tk1.field_0x20,SVar1);
    if ((uint)(ushort)a.second._34_2_ % 2 != 0) {
      a.second._34_2_ = a.second._34_2_ + -1;
    }
    local_339 = 0;
    Num::multiplyByPowerOfTen(&local_390,(Num *)local_338,(ushort)a.second._34_2_ >> 1);
    Num::operator+(&local_368,(Num *)&t_2m.field_0x20,&local_390);
    Num::operator+(__return_storage_ptr__,&local_368,(Num *)&x2.field_0x20);
    Num::~Num(&local_368);
    Num::~Num(&local_390);
    local_339 = 1;
    Num::~Num((Num *)local_338);
    Num::~Num((Num *)&t_2m.field_0x20);
    std::__cxx11::string::~string((string *)&tk1.field_0x20);
    Num::~Num((Num *)local_220);
    Num::~Num((Num *)&x4.field_0x20);
    Num::~Num((Num *)&x3.field_0x20);
    Num::~Num((Num *)&x2.field_0x20);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)local_e0);
    std::pair<Num,_Num>::~pair((pair<Num,_Num> *)&b.second.field_0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

Num divideAndConquer::multiply(const Num& n1, const Num& n2)
{
    if (n1.size == 1 || n2.size == 1)
    {
        gradeSchoolMultiplication t;

        return t.multiply(n1,n2);
    }

    Short m = std::max(n1.size, n2.size);
    Halves a, b;
    a = n1.getHalf(m);
    b = n2.getHalf(m);

    Num x1, x2, x3, x4;
    x1 = multiply(a.second, b.second);
    x2 = multiply(a.first, b.second);
    x3 = multiply(a.second, b.first);
    x4 = multiply(a.first, b.first);

    int t_x2 = x2.getNumber() + x3.getNumber();

    std::string str_t = std::to_string(t_x2);

    Num tk1 = x4.multiplyByPowerOfTen(m);
    Num t_2m (str_t, str_t.size());

    if (m % 2)
    {
        --m;
    }

    Num x5 =  tk1 + (t_2m).multiplyByPowerOfTen(m / 2) + x1;

    return x5;
}